

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

AffineSpace3ff * __thiscall
embree::SceneGraph::MultiTransformNode::get(MultiTransformNode *this,size_t i,float time)

{
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar1;
  undefined8 uVar2;
  const_reference pvVar3;
  size_type in_RDX;
  long in_RSI;
  AffineSpace3ff *in_RDI;
  float in_XMM0_Da;
  float fVar4;
  float fVar5;
  AffineSpace3ff xfm1;
  AffineSpace3ff xfm0;
  float ftime;
  int itime;
  BBox1f time_range;
  int numTimeSteps;
  AffineSpace3ff *xfm;
  int local_d1c;
  int local_d18;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  float local_c78;
  int local_c74;
  BBox1f local_c70;
  int local_c68;
  float local_c64;
  size_type local_c60;
  const_reference local_c48;
  const_reference local_c40;
  avector<AffineSpace3ff> *local_c38;
  avector<AffineSpace3ff> *local_c30;
  long local_c18;
  const_reference local_c10;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_bd8;
  undefined8 *local_bd0;
  Vector *local_bc8;
  undefined8 *local_bc0;
  undefined8 *local_b90;
  undefined8 *local_b68;
  undefined8 *local_b60;
  undefined8 *local_b58;
  undefined8 *local_b30;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_ae0;
  undefined8 *local_ad8;
  Vector *local_ad0;
  undefined8 *local_ac8;
  Vector *local_ac0;
  undefined8 *local_ab8;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_ab0;
  undefined8 *local_aa8;
  long local_a50;
  avector<AffineSpace3ff> *local_a48;
  float local_a2c;
  BBox1f *local_a28;
  float local_a20;
  float local_a1c;
  int local_a18;
  int local_a14;
  undefined4 local_a10;
  int local_a0c;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  float local_728;
  float fStack_724;
  float fStack_720;
  float fStack_71c;
  float local_6a8;
  float fStack_6a4;
  float fStack_6a0;
  float fStack_69c;
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float fStack_5dc;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  
  local_c64 = in_XMM0_Da;
  local_c60 = in_RDX;
  local_c40 = std::
              vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
              ::operator[]((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                            *)(in_RSI + 0x68),in_RDX);
  local_c38 = &local_c40->spaces;
  if ((local_c40->spaces).size_active < 2) {
    pvVar3 = std::
             vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
             ::operator[]((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                           *)(in_RSI + 0x68),local_c60);
    pAVar1 = (pvVar3->spaces).items;
    uVar2 = *(undefined8 *)((long)&(pAVar1->l).vx.field_0 + 8);
    *(undefined8 *)&(in_RDI->l).vx.field_0 = *(undefined8 *)&(pAVar1->l).vx.field_0;
    *(undefined8 *)((long)&(in_RDI->l).vx.field_0 + 8) = uVar2;
    uVar2 = *(undefined8 *)((long)&(pAVar1->l).vy.field_0 + 8);
    *(undefined8 *)&(in_RDI->l).vy.field_0 = *(undefined8 *)&(pAVar1->l).vy.field_0;
    *(undefined8 *)((long)&(in_RDI->l).vy.field_0 + 8) = uVar2;
    uVar2 = *(undefined8 *)((long)&(pAVar1->l).vz.field_0 + 8);
    *(undefined8 *)&(in_RDI->l).vz.field_0 = *(undefined8 *)&(pAVar1->l).vz.field_0;
    *(undefined8 *)((long)&(in_RDI->l).vz.field_0 + 8) = uVar2;
    uVar2 = *(undefined8 *)((long)&(pAVar1->p).field_0 + 8);
    *(undefined8 *)&(in_RDI->p).field_0 = *(undefined8 *)&(pAVar1->p).field_0;
    *(undefined8 *)((long)&(in_RDI->p).field_0 + 8) = uVar2;
  }
  else {
    local_c48 = std::
                vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                ::operator[]((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                              *)(in_RSI + 0x68),local_c60);
    local_c30 = &local_c48->spaces;
    local_c68 = (int)(local_c48->spaces).size_active;
    pvVar3 = std::
             vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
             ::operator[]((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                           *)(in_RSI + 0x68),local_c60);
    local_c70 = pvVar3->time_range;
    local_a28 = &local_c70;
    fVar4 = (local_c64 - local_c70.lower) / (local_c70.upper - local_c70.lower);
    local_a2c = fVar4;
    local_a20 = fVar4;
    fVar5 = floorf(fVar4);
    local_c64 = (float)(local_c68 + -1) * (fVar4 - fVar5);
    local_a1c = local_c64;
    fVar4 = floorf(local_c64);
    local_a0c = (int)fVar4;
    local_a10 = 0;
    local_d18 = local_a0c;
    if (local_a0c < 0) {
      local_d18 = 0;
    }
    local_a18 = local_c68 + -2;
    local_a14 = local_d18;
    local_d1c = local_a18;
    if (local_d18 < local_a18) {
      local_d1c = local_d18;
    }
    local_c74 = local_d1c;
    local_c78 = local_c64 - (float)local_d1c;
    local_c10 = std::
                vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                ::operator[]((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                              *)(in_RSI + 0x68),local_c60);
    local_c18 = (long)local_c74;
    local_a48 = &local_c10->spaces;
    local_bd8 = (local_c10->spaces).items + local_c18;
    local_bd0 = &local_cb8;
    local_b60 = &local_ca8;
    local_b68 = &local_c98;
    local_bc0 = &local_c88;
    local_cb8 = *(undefined8 *)&(local_bd8->l).vx.field_0;
    uStack_cb0 = *(undefined8 *)((long)&(local_bd8->l).vx.field_0 + 8);
    local_ac0 = &(local_bd8->l).vy;
    local_ab8 = &local_ca8;
    local_ca8 = *(undefined8 *)&local_ac0->field_0;
    uStack_ca0 = *(undefined8 *)((long)&(local_bd8->l).vy.field_0 + 8);
    local_ad0 = &(local_bd8->l).vz;
    local_ac8 = &local_c98;
    local_c98 = *(undefined8 *)&local_ad0->field_0;
    uStack_c90 = *(undefined8 *)((long)&(local_bd8->l).vz.field_0 + 8);
    local_bc8 = &local_bd8->p;
    local_c88 = *(undefined8 *)&local_bc8->field_0;
    uStack_c80 = *(undefined8 *)((long)&(local_bd8->p).field_0 + 8);
    local_b90 = local_bd0;
    local_b58 = local_bd0;
    local_b30 = local_bc0;
    local_ae0 = local_bd8;
    local_ad8 = local_bd0;
    local_ab0 = local_bd8;
    local_aa8 = local_bd0;
    local_a50 = local_c18;
    std::
    vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
    ::operator[]((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                  *)(in_RSI + 0x68),local_c60);
    fVar4 = 1.0 - local_c78;
    local_568 = (float)local_cb8;
    fStack_564 = (float)((ulong)local_cb8 >> 0x20);
    fStack_560 = (float)uStack_cb0;
    fStack_55c = (float)((ulong)uStack_cb0 >> 0x20);
    local_5e8 = (float)local_828;
    fStack_5e4 = (float)((ulong)local_828 >> 0x20);
    fStack_5e0 = (float)uStack_820;
    fStack_5dc = (float)((ulong)uStack_820 >> 0x20);
    local_c78 = 1.0 - local_c78;
    local_6a8 = (float)local_c88;
    fStack_6a4 = (float)((ulong)local_c88 >> 0x20);
    fStack_6a0 = (float)uStack_c80;
    fStack_69c = (float)((ulong)uStack_c80 >> 0x20);
    local_728 = (float)local_7f8;
    fStack_724 = (float)((ulong)local_7f8 >> 0x20);
    fStack_720 = (float)uStack_7f0;
    fStack_71c = (float)((ulong)uStack_7f0 >> 0x20);
    *(ulong *)&(in_RDI->l).vx.field_0 =
         CONCAT44(fVar4 * fStack_564 + fStack_5e4,fVar4 * local_568 + local_5e8);
    *(ulong *)((long)&(in_RDI->l).vx.field_0 + 8) =
         CONCAT44(fVar4 * fStack_55c + fStack_5dc,fVar4 * fStack_560 + fStack_5e0);
    *(undefined8 *)&(in_RDI->l).vy.field_0 = local_918;
    *(undefined8 *)((long)&(in_RDI->l).vy.field_0 + 8) = uStack_910;
    *(undefined8 *)&(in_RDI->l).vz.field_0 = local_928;
    *(undefined8 *)((long)&(in_RDI->l).vz.field_0 + 8) = uStack_920;
    *(ulong *)&(in_RDI->p).field_0 =
         CONCAT44(local_c78 * fStack_6a4 + fStack_724,local_c78 * local_6a8 + local_728);
    *(ulong *)((long)&(in_RDI->p).field_0 + 8) =
         CONCAT44(local_c78 * fStack_69c + fStack_71c,local_c78 * fStack_6a0 + fStack_720);
  }
  return in_RDI;
}

Assistant:

virtual AffineSpace3ff get(size_t i, float time) const
      {
        if (spaces[i].size() <= 1) return spaces[i][0];

        int numTimeSteps = spaces[i].size();

        BBox1f time_range = spaces[i].time_range;
        time = frac((time-time_range.lower)/time_range.size());
        time = (numTimeSteps-1)*time;
        int   itime = (int)floor(time);
        itime = min(max(itime,0),(int)numTimeSteps-2);
        float ftime = time - (float)itime;

        const AffineSpace3ff xfm0 = spaces[i][itime+0];
        const AffineSpace3ff xfm1 = spaces[i][itime+1];
        const AffineSpace3ff xfm  = lerp(xfm0,xfm1,ftime);
        return xfm;
      }